

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_string_utf8_ref(sexp ctx,sexp str,sexp i)

{
  byte bVar1;
  sexp psVar2;
  sexp_tag_t *psVar3;
  uint uVar4;
  ulong uVar5;
  sexp psVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  
  psVar6 = (str->value).type.name;
  psVar2 = (str->value).type.cpl;
  uVar5 = (ulong)i & 0xfffffffffffffffd;
  uVar7 = uVar5 + 7;
  if (-1 < (long)uVar5) {
    uVar7 = uVar5;
  }
  lVar8 = (long)uVar7 >> 3;
  bVar1 = (psVar2->value).flonum_bits[(long)&psVar6->value + lVar8];
  if (-1 < (long)(char)bVar1) {
    return (sexp)((long)(char)bVar1 << 8 | 0x1e);
  }
  if ((byte)(bVar1 + 8) < 200) {
    psVar6 = sexp_user_exception(ctx,(sexp)0x0,"string-ref: invalid utf8 byte",i);
    return psVar6;
  }
  psVar3 = &psVar6->tag;
  if (bVar1 < 0xe0) {
    uVar4 = (byte)(psVar2->value).flonum_bits[(long)psVar3 + lVar8 + 9] & 0x3f | (bVar1 & 0x3f) << 6
    ;
  }
  else {
    uVar4 = (byte)(psVar2->value).flonum_bits[(long)psVar3 + lVar8 + 9] & 0x3f;
    uVar9 = (byte)(psVar2->value).flonum_bits[(long)psVar3 + lVar8 + 10] & 0x3f;
    if (bVar1 < 0xf0) {
      return (sexp)(ulong)((uVar4 << 6 | (bVar1 & 0x1f) << 0xc | uVar9) << 8 | 0x1e);
    }
    uVar4 = (byte)(psVar2->value).flonum_bits[(long)psVar3 + lVar8 + 0xb] & 0x3f |
            uVar9 << 6 | uVar4 << 0xc | (bVar1 & 0xf) << 0x12;
  }
  return (sexp)(ulong)(uVar4 << 8 | 0x1e);
}

Assistant:

sexp sexp_string_utf8_ref (sexp ctx, sexp str, sexp i) {
  unsigned char *p=(unsigned char*)sexp_string_data(str) + sexp_unbox_string_cursor(i);
  if (*p < 0x80)
    return sexp_make_character(*p);
  else if ((*p < 0xC0) || (*p > 0xF7))
    return sexp_user_exception(ctx, NULL, "string-ref: invalid utf8 byte", i);
  else if (*p < 0xE0)
    return sexp_make_character(((p[0]&0x3F)<<6) + (p[1]&0x3F));
  else if (*p < 0xF0)
    return sexp_make_character(((p[0]&0x1F)<<12) + ((p[1]&0x3F)<<6) + (p[2]&0x3F));
  else
    return sexp_make_character(((p[0]&0x0F)<<18) + ((p[1]&0x3F)<<12) + ((p[2]&0x3F)<<6) + (p[3]&0x3F));
}